

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::Seek(BamToolsIndex *this,int64_t *position,int origin)

{
  IBamIODevice *pIVar1;
  int iVar2;
  BamException *this_00;
  undefined4 in_register_00000014;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[6])(pIVar1,position,CONCAT44(in_register_00000014,origin));
  if ((char)iVar2 != '\0') {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamToolsIndex::Seek",&local_59);
  std::__cxx11::string::string((string *)&local_58,"could not seek in BAI file",&local_5a);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::Seek(const int64_t& position, const int origin) {
    if ( !m_resources.Device->Seek(position, origin) )
        throw BamException("BamToolsIndex::Seek", "could not seek in BAI file");
}